

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void box3_subdivide(box3_t bbox,box3_t *out)

{
  undefined8 *puVar1;
  box3_t b;
  vec3_t a;
  vec3_t a_00;
  undefined1 auVar2 [12];
  undefined8 uVar3;
  box3_t bVar4;
  ulong uVar5;
  vec3_t vVar6;
  vec3_t vVar7;
  undefined8 in_stack_fffffffffffffe60;
  box3_t local_e4;
  uint local_cc;
  undefined8 uStack_c8;
  uint32_t i_1;
  float local_c0;
  undefined8 local_b4;
  vec3_t center;
  uint local_8c;
  uint32_t i;
  vec3_t vs [8];
  vec3_t ps [2];
  box3_t *out_local;
  
  bVar4 = bbox;
  uVar3 = bbox.max._0_8_;
  ps[1]._4_8_ = out;
  vs[7].y = bbox.min.x;
  vs[7].z = bbox.min.y;
  ps[0].x = bbox.min.z;
  ps[0].y = (float)uVar3;
  ps[0].z = SUB84(uVar3,4);
  ps[1].x = bbox.max.z;
  for (local_8c = 0; local_8c < 8; local_8c = local_8c + 1) {
    uVar5 = (ulong)local_8c;
    vVar6 = vec3(vs[(long)cube_table[uVar5].x + 7].y,vs[(long)cube_table[uVar5].y + 7].z,
                 ps[cube_table[uVar5].z].x);
    center._4_8_ = vVar6._0_8_;
    *(undefined8 *)(&stack0xffffffffffffff78 + uVar5 * 0xc) = center._4_8_;
    vs[uVar5].x = vVar6.z;
  }
  b.max.y = (float)(int)in_stack_fffffffffffffe60;
  b.max.z = (float)(int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  auVar2 = SUB1612(bVar4._8_16_,0);
  b.min.x = (float)auVar2._0_4_;
  b.min.y = (float)auVar2._4_4_;
  b.min.z = (float)auVar2._8_4_;
  b.max.x = (float)SUB164(bVar4._8_16_,0xc);
  vVar6 = box3_center(b);
  local_c0 = vVar6.z;
  uStack_c8 = vVar6._0_8_;
  local_b4 = uStack_c8;
  center.x = local_c0;
  for (local_cc = 0; local_cc < 8; local_cc = local_cc + 1) {
    uVar5 = (ulong)local_cc;
    puVar1 = (undefined8 *)(ps[1]._4_8_ + uVar5 * 0x18);
    a_00.z = center.x;
    a_00.x = (float)(undefined4)local_b4;
    a_00.y = (float)local_b4._4_4_;
    vVar7.z = vs[uVar5].x;
    vVar7._0_8_ = *(undefined8 *)(&stack0xffffffffffffff78 + uVar5 * 0xc);
    vVar7 = vec3_min(a_00,vVar7);
    a.z = center.x;
    a.x = (float)(undefined4)local_b4;
    a.y = (float)local_b4._4_4_;
    vVar6.z = vs[local_cc].x;
    vVar6._0_8_ = *(undefined8 *)(&stack0xffffffffffffff78 + (ulong)local_cc * 0xc);
    vVar6 = vec3_max(a,vVar6);
    box3(&local_e4,vVar7,vVar6);
    *puVar1 = local_e4.min._0_8_;
    puVar1[1] = local_e4._8_8_;
    puVar1[2] = local_e4.max._4_8_;
  }
  return;
}

Assistant:

void
box3_subdivide(box3_t bbox, box3_t out[3]) {
    vec3_t  ps[2] = { bbox.min, bbox.max };

    vec3_t  vs[8];
    for( uint32_t i = 0; i < 8; ++i ) {
        vs[i] = vec3(ps[cube_table[i].x].x, ps[cube_table[i].y].y, ps[cube_table[i].z].z);
    }

    vec3_t  center = box3_center(bbox);

    for( uint32_t i = 0; i < 8; ++i ) {
        out[i] = box3(vec3_min(center, vs[i]), vec3_max(center, vs[i]));
    }
}